

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

void __thiscall
VGMPlayer::RefreshMuting(VGMPlayer *this,CHIP_DEVICE *chipDev,PLR_MUTE_OPTS *muteOpts)

{
  DEV_DATA *pDVar1;
  DEVFUNC_OPTMASK p_Var2;
  DEV_INFO *devInf;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  do {
    pDVar1 = (chipDev->base).defInf.dataPtr;
    if ((pDVar1 != (DEV_DATA *)0x0) &&
       (p_Var2 = ((chipDev->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
      (*p_Var2)(pDVar1,*(UINT32 *)((long)muteOpts->chnMute + lVar3));
    }
    chipDev = (CHIP_DEVICE *)(chipDev->base).linkDev;
  } while ((chipDev != (CHIP_DEVICE *)0x0) && (bVar4 = lVar3 == 0, lVar3 = lVar3 + 4, bVar4));
  return;
}

Assistant:

void VGMPlayer::RefreshMuting(VGMPlayer::CHIP_DEVICE& chipDev, const PLR_MUTE_OPTS& muteOpts)
{
	VGM_BASEDEV* clDev;
	UINT8 linkCntr = 0;
	
	for (clDev = &chipDev.base; clDev != NULL && linkCntr < 2; clDev = clDev->linkDev, linkCntr ++)
	{
		DEV_INFO* devInf = &clDev->defInf;
		if (devInf->dataPtr != NULL && devInf->devDef->SetMuteMask != NULL)
			devInf->devDef->SetMuteMask(devInf->dataPtr, muteOpts.chnMute[linkCntr]);
	}
	
	return;
}